

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O1

bool __thiscall
duckdb::CSVSchema::SchemasMatch
          (CSVSchema *this,string *error_message,SnifferResult *sniffer_result,string *cur_file_path
          ,bool is_minimal_sniffer)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pCVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  iterator iVar9;
  bool bVar10;
  size_type sVar11;
  undefined3 in_register_00000081;
  CSVColumnInfo *column;
  pointer pCVar12;
  pointer pCVar13;
  size_type __n;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  vector<duckdb::CSVColumnInfo,_true> *__range3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>_>
  current_schema;
  ostringstream error;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_228;
  undefined4 local_21c;
  string *local_218;
  string *local_210;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1f8;
  LogicalType local_1c0;
  idx_t local_1a8 [3];
  char local_190;
  ios_base local_150 [264];
  LogicalType local_48;
  
  local_21c = CONCAT31(in_register_00000081,is_minimal_sniffer);
  local_1f8._M_buckets = &local_1f8._M_single_bucket;
  local_1f8._M_bucket_count = 1;
  local_1f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1f8._M_element_count = 0;
  local_1f8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1f8._M_rehash_policy._M_next_resize = 0;
  local_1f8._M_single_bucket = (__node_base_ptr)0x0;
  local_228 = &sniffer_result->names;
  local_218 = error_message;
  local_210 = cur_file_path;
  if ((sniffer_result->names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (sniffer_result->names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar11 = 0;
    do {
      pvVar5 = vector<duckdb::LogicalType,_true>::operator[](&sniffer_result->return_types,sVar11);
      LogicalType::LogicalType(&local_48,pvVar5);
      LogicalType::LogicalType(&local_1c0,&local_48);
      local_1a8[0] = sVar11;
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](local_228,sVar11);
      pmVar7 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_1f8,pvVar6);
      _Var3._M_pi = local_1c0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar2 = local_1c0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (pmVar7->type).id_ = local_1c0.id_;
      (pmVar7->type).physical_type_ = local_1c0.physical_type_;
      uVar14 = *(undefined4 *)
                &(pmVar7->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar15 = *(undefined4 *)
                ((long)&(pmVar7->type).type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      uVar16 = *(undefined4 *)
                &(pmVar7->type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar17 = *(undefined4 *)
                ((long)&(pmVar7->type).type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (pmVar7->type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pmVar7->type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1c0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1c0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (pmVar7->type).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (pmVar7->type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      (pmVar7->type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var3._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_208 = uVar14;
        uStack_204 = uVar15;
        uStack_200 = uVar16;
        uStack_1fc = uVar17;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        uVar14 = local_208;
        uVar15 = uStack_204;
        uVar16 = uStack_200;
        uVar17 = uStack_1fc;
      }
      _Var3._M_pi = local_1c0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_1c0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(uVar15,uVar14);
      local_1c0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = uVar17;
      local_1c0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = uVar16;
      if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      pmVar7->idx = local_1a8[0];
      LogicalType::~LogicalType(&local_1c0);
      LogicalType::~LogicalType(&local_48);
      sVar11 = sVar11 + 1;
    } while (sVar11 < (ulong)((long)(sniffer_result->names).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(sniffer_result->names).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if ((char)local_21c == '\0') {
LAB_0150ac55:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"Schema mismatch between globbed files.",0x26);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,anon_var_dwarf_4f000dd + 8,1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"Main file schema: ",0x12);
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1c0,(this->file_path)._M_dataplus._M_p,
                        (this->file_path)._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,anon_var_dwarf_4f000dd + 8,1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,"Current file: ",0xe)
    ;
    poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1c0,(local_210->_M_dataplus)._M_p,
                        local_210->_M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,anon_var_dwarf_4f000dd + 8,1);
    pCVar12 = (this->columns).
              super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
              super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (this->columns).
             super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
             super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar10 = true;
    if (pCVar12 != pCVar1) {
      do {
        iVar9 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_1f8,&pCVar12->name);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_true>
            ._M_cur == (__node_type *)0x0) {
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1c0,"Column with name: \"",0x13);
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1c0,(pCVar12->name)._M_dataplus._M_p,
                              (pCVar12->name)._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" is missing",0xc);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,anon_var_dwarf_4f000dd + 8,1);
LAB_0150ae9d:
          bVar10 = false;
        }
        else {
          pmVar7 = ::std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_1f8,&pCVar12->name);
          bVar4 = CanWeCastIt((pmVar7->type).id_,(pCVar12->type).id_);
          if (!bVar4) {
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c0,"Column with name: \"",0x13);
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1c0,(pCVar12->name)._M_dataplus._M_p,
                                (pCVar12->name)._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" is expected to have type: ",0x1c);
            LogicalType::ToString_abi_cxx11_(&local_248,&pCVar12->type);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,local_248._M_dataplus._M_p,local_248._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p);
            }
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c0," But has type: ",0xf);
            pmVar7 = ::std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&local_1f8,&pCVar12->name);
            LogicalType::ToString_abi_cxx11_(&local_248,&pmVar7->type);
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1c0,local_248._M_dataplus._M_p,
                                local_248._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,anon_var_dwarf_4f000dd + 8,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p);
            }
            goto LAB_0150ae9d;
          }
        }
        pCVar12 = pCVar12 + 1;
      } while (pCVar12 != pCVar1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,
               "Potential Fix: Since your schema has a mismatch, consider setting union_by_name=true."
               ,0x55);
    if (!bVar10) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::operator=((string *)local_218,(string *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c0);
    ::std::ios_base::~ios_base(local_150);
  }
  else {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1c0,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)sniffer_result);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1a8,
             &local_228->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    local_190 = *(char *)&sniffer_result[1].return_types.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    if (local_190 != '\0') goto LAB_0150ac40;
    pCVar12 = (this->columns).
              super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
              super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (this->columns).
             super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
             super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pCVar12 != pCVar1) {
      bVar10 = true;
      do {
        iVar9 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_1f8,&pCVar12->name);
        if (iVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_true>
            ._M_cur == (__node_type *)0x0) {
          bVar10 = false;
          break;
        }
        pCVar12 = pCVar12 + 1;
      } while (pCVar12 != pCVar1);
      if (!bVar10) {
        pCVar12 = (this->columns).
                  super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar1 = (this->columns).
                 super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                 super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (((long)(sniffer_result->return_types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(sniffer_result->return_types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
            ((long)pCVar1 - (long)pCVar12 >> 3) * -0x6db6db6db6db6db7 != 0) {
LAB_0150ac40:
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1a8);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1c0
                    );
          goto LAB_0150ac55;
        }
        if (pCVar12 != pCVar1) {
          bVar10 = true;
          sVar11 = 0;
          do {
            pCVar13 = pCVar12 + 1;
            pvVar5 = vector<duckdb::LogicalType,_true>::operator[]
                               (&sniffer_result->return_types,sVar11);
            bVar4 = LogicalType::operator==(&pCVar12->type,pvVar5);
            if (!bVar4) {
              bVar10 = false;
            }
            sVar11 = sVar11 + 1;
            pCVar12 = pCVar13;
          } while (bVar4 && pCVar13 != pCVar1);
          if (!bVar10) goto LAB_0150ac40;
        }
        pCVar12 = (this->columns).
                  super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pCVar1 = (this->columns).
                 super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                 super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pCVar12 != pCVar1) {
          __n = 0;
          do {
            pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ::operator[](local_228,__n);
            ::std::__cxx11::string::_M_assign((string *)pvVar6);
            pCVar12 = pCVar12 + 1;
            __n = __n + 1;
          } while (pCVar12 != pCVar1);
        }
      }
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1c0);
    bVar10 = true;
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1f8);
  return bVar10;
}

Assistant:

bool CSVSchema::SchemasMatch(string &error_message, SnifferResult &sniffer_result, const string &cur_file_path,
                             bool is_minimal_sniffer) const {
	D_ASSERT(sniffer_result.names.size() == sniffer_result.return_types.size());
	bool match = true;
	unordered_map<string, TypeIdxPair> current_schema;

	for (idx_t i = 0; i < sniffer_result.names.size(); i++) {
		// Populate our little schema
		current_schema[sniffer_result.names[i]] = {sniffer_result.return_types[i], i};
	}
	if (is_minimal_sniffer) {
		auto min_sniffer = static_cast<AdaptiveSnifferResult &>(sniffer_result);
		if (!min_sniffer.more_than_one_row) {
			bool min_sniff_match = true;
			// If we don't have more than one row, either the names must match or the types must match.
			for (auto &column : columns) {
				if (current_schema.find(column.name) == current_schema.end()) {
					min_sniff_match = false;
					break;
				}
			}
			if (min_sniff_match) {
				return true;
			}
			// Otherwise, the types must match.
			min_sniff_match = true;
			if (sniffer_result.return_types.size() == columns.size()) {
				idx_t return_type_idx = 0;
				for (auto &column : columns) {
					if (column.type != sniffer_result.return_types[return_type_idx++]) {
						min_sniff_match = false;
						break;
					}
				}
			} else {
				min_sniff_match = false;
			}
			if (min_sniff_match) {
				// If we got here, we have the right types but the wrong names, lets fix the names
				idx_t sniff_name_idx = 0;
				for (auto &column : columns) {
					sniffer_result.names[sniff_name_idx++] = column.name;
				}
				return true;
			}
		}
		// If we got to this point, the minimal sniffer doesn't match, we throw an error.
	}
	// Here we check if the schema of a given file matched our original schema
	// We consider it's not a match if:
	// 1. The file misses columns that were defined in the original schema.
	// 2. They have a column match, but the types do not match.
	std::ostringstream error;
	error << "Schema mismatch between globbed files."
	      << "\n";
	error << "Main file schema: " << file_path << "\n";
	error << "Current file: " << cur_file_path << "\n";

	for (auto &column : columns) {
		if (current_schema.find(column.name) == current_schema.end()) {
			error << "Column with name: \"" << column.name << "\" is missing"
			      << "\n";
			match = false;
		} else {
			if (!CanWeCastIt(current_schema[column.name].type.id(), column.type.id())) {
				error << "Column with name: \"" << column.name
				      << "\" is expected to have type: " << column.type.ToString();
				error << " But has type: " << current_schema[column.name].type.ToString() << "\n";
				match = false;
			}
		}
	}

	// Lets suggest some potential fixes
	error << "Potential Fix: Since your schema has a mismatch, consider setting union_by_name=true.";
	if (!match) {
		error_message = error.str();
	}
	return match;
}